

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itree.c
# Opt level: O1

cell_index_t itree_add_sib(itree_t *t,cell_index_t end,cell_id_t id)

{
  uint uVar1;
  cell_t *pcVar2;
  
  uVar1 = t->n_cell;
  if (uVar1 == t->max_n_cell) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/itree.c"
            ,0x77,"index cells exhausted (exceeded the allocated size %d)\n");
    exit(1);
  }
  if (uVar1 < t->max_n_cell) {
    t->n_cell = uVar1 + 1;
    pcVar2 = t->cell;
    if (uVar1 != 0) {
      pcVar2[end].sib = uVar1;
    }
    pcVar2[uVar1].id = id;
    pcVar2[uVar1].child = 0xffffffff;
    pcVar2[uVar1].sib = 0xffffffff;
    return uVar1;
  }
  __assert_fail("t->n_cell < t->max_n_cell",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libcommon/itree.c"
                ,0x4d,"cell_index_t itree_new_cell(itree_t *)");
}

Assistant:

cell_index_t itree_add_sib(itree_t *t,
			   cell_index_t end,
			   cell_id_t id)
{
    cell_index_t new;
    cell_t *cell;

    if (t->n_cell == t->max_n_cell) {
	E_FATAL("index cells exhausted (exceeded the allocated size %d)\n",t->max_n_cell);
    }

    new = itree_new_cell(t);

    cell = t->cell;
	
    if (new != 0)
	/* this is not the first cell, so link it w/ prior */
	cell[end].sib = new;
    
    cell[new].id = id;
    cell[new].child = NULL_INDEX;
    cell[new].sib = NULL_INDEX;

    return new;
}